

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
OpenMD::Polynomial<double>::addCoefficient
          (Polynomial<double> *this,int exponent,double *coefficient)

{
  bool bVar1;
  iterator this_00;
  iterator iVar2;
  pointer ppVar3;
  double *in_RDX;
  double *in_RDI;
  iterator i;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_ffffffffffffffc8;
  double dVar4;
  int exponent_00;
  
  this_00 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
            find(in_stack_ffffffffffffffc8,(key_type *)0x3ca8e6);
  iVar2 = end((Polynomial<double> *)in_stack_ffffffffffffffc8);
  exponent_00 = (int)((ulong)iVar2._M_node >> 0x20);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffd8);
  if (bVar1) {
    dVar4 = *in_RDX;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_double>_> *)0x3ca927);
    ppVar3->second = dVar4 + ppVar3->second;
  }
  else {
    setCoefficient((Polynomial<double> *)this_00._M_node,exponent_00,in_RDI);
  }
  return;
}

Assistant:

void addCoefficient(int exponent, const Real& coefficient) {
      iterator i = polyPairMap_.find(exponent);

      if (i != end()) {
        i->second += coefficient;
      } else {
        setCoefficient(exponent, coefficient);
      }
    }